

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::DataSegment::DataSegment(DataSegment *this,string_view name)

{
  Location local_40;
  DataSegment *local_20;
  DataSegment *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (DataSegment *)name.data_;
  local_20 = this;
  string_view::to_string_abi_cxx11_(&this->name,(string_view *)&this_local);
  Location::Location(&local_40);
  Var::Var(&this->memory_var,0xffffffff,&local_40);
  this->passive = false;
  intrusive_list<wabt::Expr>::intrusive_list(&this->offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data);
  return;
}

Assistant:

explicit DataSegment(string_view name) : name(name.to_string()) {}